

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QRenderRule * __thiscall QRenderRule::borderClip(QRenderRule *this,QRect r)

{
  QStyleSheetBorderData *pQVar1;
  long lVar2;
  undefined8 in_RCX;
  long lVar3;
  QSharedDataPointer<QStyleSheetBorderData> *this_00;
  long in_FS_OFFSET;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  QSize local_68;
  QSize local_60;
  QSize local_58;
  QSize local_50;
  QRect local_48;
  long local_38;
  
  local_48._0_8_ = r._8_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(r._0_8_ + 0x48) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QPainterPath::QPainterPath((QPainterPath *)this);
      return this;
    }
    goto LAB_00341064;
  }
  this_00 = (QSharedDataPointer<QStyleSheetBorderData> *)(r._0_8_ + 0x48);
  local_50.wd.m_i = -1;
  local_50.ht.m_i = -1;
  local_58.wd.m_i = -1;
  local_58.ht.m_i = -1;
  local_60.wd.m_i = -1;
  local_60.ht.m_i = -1;
  local_68.wd.m_i = -1;
  local_68.ht.m_i = -1;
  local_48._8_8_ = in_RCX;
  pQVar1 = QSharedDataPointer<QStyleSheetBorderData>::operator->(this_00);
  qNormalizeRadii(&local_48,pQVar1->radii,&local_50,&local_58,&local_60,&local_68);
  if (local_50.ht.m_i == 0 && local_50.wd.m_i == 0) {
    if (local_58.ht.m_i != 0 || local_58.wd.m_i != 0) goto LAB_00340d62;
    if (local_60.ht.m_i != 0 || local_60.wd.m_i != 0) goto LAB_00340d62;
    if (local_68.ht.m_i != 0 || local_68.wd.m_i != 0) goto LAB_00340d62;
    QPainterPath::QPainterPath((QPainterPath *)this);
  }
  else {
LAB_00340d62:
    lVar2 = (long)local_48.x1.m_i;
    dVar4 = (double)local_48.x1.m_i;
    lVar3 = (long)local_48.y1.m_i;
    dVar5 = (double)local_48.y1.m_i;
    pQVar1 = (this_00->d).ptr;
    *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)this);
    dVar7 = (double)pQVar1->borders[0] * 0.5 + dVar5;
    QPainterPath::moveTo((QPainterPath *)this,(double)local_50.wd.m_i + dVar4,dVar7);
    dVar6 = (double)((local_48.x2.m_i - lVar2) + 1) + dVar4;
    QPainterPath::lineTo((QPainterPath *)this,dVar6 - (double)local_58.wd.m_i,dVar7);
    dVar8 = (double)pQVar1->borders[1];
    dVar6 = dVar6 - dVar8 * 0.5;
    QPainterPath::arcTo((QPainterPath *)this,(dVar6 - (double)(local_58.wd.m_i * 2)) + dVar8,dVar7,
                        (double)(local_58.wd.m_i * 2 - pQVar1->borders[1]),
                        (double)(local_58.ht.m_i * 2 - pQVar1->borders[0]),90.0,-90.0);
    dVar7 = (double)((local_48.y2.m_i - lVar3) + 1) + dVar5;
    QPainterPath::lineTo((QPainterPath *)this,dVar6,dVar7 - (double)local_68.ht.m_i);
    dVar9 = (double)pQVar1->borders[2];
    dVar8 = dVar7 - dVar9 * 0.5;
    QPainterPath::arcTo((QPainterPath *)this,
                        (double)pQVar1->borders[1] + (dVar6 - (double)(local_68.wd.m_i * 2)),
                        (dVar8 - (double)(local_68.ht.m_i * 2)) + dVar9,
                        (double)(local_68.wd.m_i * 2 - pQVar1->borders[1]),
                        (double)(local_68.ht.m_i * 2 - pQVar1->borders[2]),0.0,-90.0);
    QPainterPath::lineTo((QPainterPath *)this,(double)local_60.wd.m_i + dVar4,dVar8);
    dVar4 = (double)pQVar1->borders[3] * 0.5 + dVar4;
    QPainterPath::arcTo((QPainterPath *)this,dVar4,
                        (double)pQVar1->borders[2] * 0.5 + (dVar7 - (double)(local_60.ht.m_i * 2)),
                        (double)(local_60.wd.m_i * 2 - pQVar1->borders[3]),
                        (double)(local_60.ht.m_i * 2 - pQVar1->borders[2]),270.0,-90.0);
    QPainterPath::lineTo((QPainterPath *)this,dVar4,(double)local_50.ht.m_i + dVar5);
    QPainterPath::arcTo((QPainterPath *)this,dVar4,(double)pQVar1->borders[0] * 0.5 + dVar5,
                        (double)(local_50.wd.m_i * 2 - pQVar1->borders[3]),
                        (double)(local_50.ht.m_i * 2 - pQVar1->borders[0]),180.0,-90.0);
    QPainterPath::closeSubpath();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
LAB_00341064:
  __stack_chk_fail();
}

Assistant:

QPainterPath QRenderRule::borderClip(QRect r)
{
    if (!hasBorder())
        return QPainterPath();

    QSize tlr, trr, blr, brr;
    qNormalizeRadii(r, bd->radii, &tlr, &trr, &blr, &brr);
    if (tlr.isNull() && trr.isNull() && blr.isNull() && brr.isNull())
        return QPainterPath();

    const QRectF rect(r);
    const int *borders = border()->borders;
    QPainterPath path;
    qreal curY = rect.y() + borders[TopEdge]/2.0;
    path.moveTo(rect.x() + tlr.width(), curY);
    path.lineTo(rect.right() - trr.width(), curY);
    qreal curX = rect.right() - borders[RightEdge]/2.0;
    path.arcTo(curX - 2*trr.width() + borders[RightEdge], curY,
               trr.width()*2 - borders[RightEdge], trr.height()*2 - borders[TopEdge], 90, -90);

    path.lineTo(curX, rect.bottom() - brr.height());
    curY = rect.bottom() - borders[BottomEdge]/2.0;
    path.arcTo(curX - 2*brr.width() + borders[RightEdge], curY - 2*brr.height() + borders[BottomEdge],
               brr.width()*2 - borders[RightEdge], brr.height()*2 - borders[BottomEdge], 0, -90);

    path.lineTo(rect.x() + blr.width(), curY);
    curX = rect.left() + borders[LeftEdge]/2.0;
    path.arcTo(curX, rect.bottom() - 2*blr.height() + borders[BottomEdge]/2.0,
               blr.width()*2 - borders[LeftEdge], blr.height()*2 - borders[BottomEdge], 270, -90);

    path.lineTo(curX, rect.top() + tlr.height());
    path.arcTo(curX, rect.top() + borders[TopEdge]/2.0,
               tlr.width()*2 - borders[LeftEdge], tlr.height()*2 - borders[TopEdge], 180, -90);

    path.closeSubpath();
    return path;
}